

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_min_bary(REF_INTERP ref_interp,REF_DBL *min_bary)

{
  double dVar1;
  int iVar2;
  REF_MPI ref_mpi;
  REF_GRID pRVar3;
  REF_NODE pRVar4;
  REF_DBL *pRVar5;
  uint uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  double dVar11;
  REF_DBL this_bary;
  
  ref_mpi = ref_interp->ref_mpi;
  pRVar3 = ref_interp->to_grid;
  pRVar4 = pRVar3->node;
  *min_bary = 1.0;
  iVar2 = pRVar4->max;
  dVar11 = 1.0;
  lVar8 = 0x18;
  for (lVar9 = 0; lVar9 < iVar2; lVar9 = lVar9 + 1) {
    if ((-1 < pRVar4->global[lVar9]) && (pRVar4->ref_mpi->id == pRVar4->part[lVar9])) {
      if (ref_interp->cell[lVar9] == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x925,"ref_interp_min_bary","node needs to be localized");
        return 1;
      }
      pRVar5 = ref_interp->bary;
      this_bary = *(double *)((long)pRVar5 + lVar8 + -0x18);
      dVar1 = *(double *)((long)pRVar5 + lVar8 + -0x10);
      if (dVar1 <= this_bary) {
        this_bary = dVar1;
      }
      dVar1 = *(double *)((long)pRVar5 + lVar8 + -8);
      if (dVar1 <= this_bary) {
        this_bary = dVar1;
      }
      if ((pRVar3->twod == 0) && (*(double *)((long)pRVar5 + lVar8) <= this_bary)) {
        this_bary = *(double *)((long)pRVar5 + lVar8);
      }
      if (this_bary <= dVar11) {
        dVar11 = this_bary;
      }
      *min_bary = dVar11;
    }
    lVar8 = lVar8 + 0x20;
  }
  this_bary = dVar11;
  uVar6 = ref_mpi_min(ref_mpi,&this_bary,min_bary,3);
  if (uVar6 == 0) {
    uVar6 = ref_mpi_bcast(ref_mpi,min_bary,1,3);
    if (uVar6 == 0) {
      return 0;
    }
    pcVar10 = "bcast";
    uVar7 = 0x931;
  }
  else {
    pcVar10 = "min";
    uVar7 = 0x930;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar7,
         "ref_interp_min_bary",(ulong)uVar6,pcVar10);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_interp_min_bary(REF_INTERP ref_interp,
                                       REF_DBL *min_bary) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_INT node;
  REF_DBL this_bary;

  *min_bary = 1.0;

  each_ref_node_valid_node(to_node, node) if (ref_node_owned(to_node, node)) {
    RUS(REF_EMPTY, ref_interp->cell[node], "node needs to be localized");

    this_bary =
        MIN(MIN(ref_interp->bary[0 + 4 * node], ref_interp->bary[1 + 4 * node]),
            ref_interp->bary[2 + 4 * node]);
    if (!ref_grid_twod(to_grid)) {
      this_bary = MIN(this_bary, ref_interp->bary[3 + 4 * node]);
    }
    *min_bary = MIN(*min_bary, this_bary);
  }
  this_bary = *min_bary;
  RSS(ref_mpi_min(ref_mpi, &this_bary, min_bary, REF_DBL_TYPE), "min");
  RSS(ref_mpi_bcast(ref_mpi, min_bary, 1, REF_DBL_TYPE), "bcast");

  return REF_SUCCESS;
}